

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

nk_rect nk_widget_bounds(nk_context *ctx)

{
  nk_rect bounds;
  nk_rect local_18;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x4eb7,"struct nk_rect nk_widget_bounds(struct nk_context *)");
  }
  if (ctx->current != (nk_window *)0x0) {
    nk_layout_peek(&local_18,ctx);
    return local_18;
  }
  __assert_fail("ctx->current",
                "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                ,0x4eb8,"struct nk_rect nk_widget_bounds(struct nk_context *)");
}

Assistant:

NK_API struct nk_rect
nk_widget_bounds(struct nk_context *ctx)
{
    struct nk_rect bounds;
    NK_ASSERT(ctx);
    NK_ASSERT(ctx->current);
    if (!ctx || !ctx->current)
        return nk_rect(0,0,0,0);
    nk_layout_peek(&bounds, ctx);
    return bounds;
}